

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SlaterIntegrals.hpp
# Opt level: O3

RealType sSTOCoulInt(RealType a,RealType b,int m,int n,RealType R)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  int iVar18;
  uint uVar19;
  RealType *pRVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  uint uVar26;
  uint uVar27;
  ulong uVar28;
  long lVar29;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  RealType RVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double local_160;
  double local_120;
  undefined1 local_108 [16];
  int local_d8;
  int local_48;
  
  dVar36 = a + a;
  dVar33 = dVar36 * R;
  if (2.220446049250313e-16 <= ABS(dVar33)) {
    local_160 = 1.0;
    uVar27 = m * 2;
    dVar39 = (double)(int)uVar27;
    local_108._8_4_ = in_XMM0_Dc;
    local_108._0_8_ = dVar33;
    local_108._12_4_ = in_XMM0_Dd;
    dVar3 = pow(dVar33,dVar39);
    lVar23 = (long)(int)uVar27;
    dVar36 = fact[lVar23];
    iVar18 = m * 2 + -1;
    if (0 < m) {
      dVar2 = 1.0;
      dVar30 = 1.0;
      local_160 = 1.0;
      iVar9 = iVar18;
      do {
        dVar2 = dVar2 * (dVar33 / dVar30);
        local_160 = local_160 + dVar2;
        dVar30 = dVar30 + 1.0;
        iVar9 = iVar9 + -1;
      } while (iVar9 != 0);
      local_160 = local_160 / dVar2;
    }
    dVar30 = -dVar33;
    dVar2 = exp(dVar30);
    dVar38 = exp(dVar30);
    dVar3 = (dVar3 / (dVar36 * R)) * ((dVar33 - dVar39) * (dVar2 / dVar33) * local_160 - dVar38) +
            1.0 / R + 0.0;
    dVar2 = 0.0 / dVar3;
    dVar39 = pow(a * R,dVar39);
    dVar38 = (double)n;
    if ((a != b) || (NAN(a) || NAN(b))) {
      if ((b != 0.0) || (NAN(b))) {
        dVar36 = (-a * dVar39) / ((dVar38 + dVar38) * dVar36);
        if (n < 1) {
          local_120 = 0.0;
        }
        else {
          uVar6 = n * 2;
          lVar24 = (long)iVar18;
          dVar39 = (a - b) * R;
          dVar33 = (a + b) * R;
          uVar28 = 1;
          if (1 < (int)uVar6) {
            uVar28 = (ulong)uVar6;
          }
          lVar25 = 0;
          uVar17 = 0;
          local_120 = 0.0;
          local_48 = iVar18;
          do {
            lVar22 = uVar17 + lVar23;
            iVar9 = (int)uVar17;
            if (lVar22 == 0 || SCARRY8(uVar17,lVar23) != lVar22 < 0) {
              dVar30 = 0.0;
            }
            else {
              dVar30 = 0.0;
              lVar29 = 0;
              local_108._0_4_ = iVar18;
              uVar12 = 0;
              uVar16 = m * -2;
              iVar1 = local_48;
              do {
                uVar16 = uVar16 + 1;
                uVar13 = 0;
                if (0 < (int)uVar16) {
                  uVar13 = (ulong)uVar16;
                }
                iVar11 = (int)uVar12;
                uVar7 = uVar12;
                if (iVar9 < iVar11) {
                  uVar7 = uVar17;
                }
                lVar21 = lVar24 + uVar17 + uVar12;
                if (0x97 < lVar21) goto LAB_0028f097;
                iVar10 = iVar9;
                if (iVar11 < iVar9) {
                  iVar10 = iVar11;
                }
                dVar38 = 0.0;
                if ((long)(uVar12 - lVar24) <= (long)iVar10) {
                  pRVar20 = fact + -uVar13;
                  lVar21 = 0;
                  do {
                    dVar41 = *(double *)((long)pRVar20 + lVar29) *
                             fact[lVar21 + (long)(int)local_108._0_4_ + uVar13];
                    if (((int)uVar13 + (int)lVar21 & 1U) == 0) {
                      dVar34 = fact[lVar24] / dVar41;
                      dVar41 = *(double *)((long)pRVar20 + lVar25) * fact[lVar21 + uVar13];
                      RVar37 = fact[uVar17];
                    }
                    else {
                      dVar34 = fact[uVar17] /
                               (*(double *)((long)pRVar20 + lVar25) * fact[lVar21 + uVar13]);
                      RVar37 = -fact[lVar24];
                    }
                    dVar38 = dVar38 + (RVar37 / dVar41) * dVar34;
                    lVar21 = lVar21 + 1;
                    pRVar20 = pRVar20 + -1;
                  } while (((int)uVar7 + 1) - uVar13 != lVar21);
                }
                if ((dVar39 != 0.0) || (NAN(dVar39))) {
                  dVar41 = exp(dVar39);
                  dVar34 = exp(-dVar39);
                  dVar41 = dVar41 - dVar34;
                  dVar34 = exp(dVar39);
                  dVar4 = exp(-dVar39);
                  dVar40 = dVar41;
                  if (uVar12 == 0) {
                    dVar31 = 1.0;
                  }
                  else {
                    uVar13 = 0;
                    dVar5 = 1.0;
                    dVar31 = 1.0;
                    do {
                      uVar13 = uVar13 + 1;
                      dVar32 = -dVar34 - dVar4;
                      if ((uVar13 & 1) == 0) {
                        dVar32 = dVar41;
                      }
                      dVar35 = dVar39 / dVar5;
                      dVar5 = dVar5 + 1.0;
                      dVar31 = dVar31 * dVar35;
                      dVar40 = dVar40 + dVar32 * dVar31;
                    } while (uVar12 != uVar13);
                  }
                  dVar40 = dVar40 / (dVar31 * dVar39);
                }
                else {
                  puts("WARNING, a = 0 in RosenB");
                  dVar41 = pow(-1.0,(double)iVar11);
                  dVar40 = (1.0 - dVar41) / (double)(iVar11 + 1);
                }
                dVar41 = 0.0;
                if ((dVar33 != 0.0) || (NAN(dVar33))) {
                  dVar41 = 1.0;
                  if (0 < (long)(~uVar12 + lVar22)) {
                    dVar4 = 1.0;
                    dVar34 = 1.0;
                    dVar41 = 1.0;
                    iVar11 = iVar1;
                    do {
                      dVar34 = dVar34 * (dVar33 / dVar4);
                      dVar41 = dVar41 + dVar34;
                      dVar4 = dVar4 + 1.0;
                      iVar11 = iVar11 + -1;
                    } while (iVar11 != 0);
                    dVar41 = dVar41 / dVar34;
                  }
                  dVar34 = exp(-dVar33);
                  dVar41 = (dVar34 / dVar33) * dVar41;
                }
                dVar30 = dVar30 + dVar38 * dVar40 * dVar41;
                uVar12 = uVar12 + 1;
                local_108._0_4_ = local_108._0_4_ + -1;
                lVar29 = lVar29 + 8;
                iVar1 = iVar1 + -1;
              } while (uVar12 != uVar27);
            }
            dVar38 = fact[uVar17];
            dVar41 = pow(b * R,(double)iVar9);
            dVar41 = dVar41 * (((double)(int)(uVar6 - iVar9) * dVar30) / dVar38);
            local_120 = local_120 + dVar41;
            if (ABS(dVar41) < dVar2 / ABS(dVar36)) break;
            uVar17 = uVar17 + 1;
            uVar27 = uVar27 + 1;
            lVar25 = lVar25 + 8;
            local_48 = local_48 + 1;
          } while (uVar17 != uVar28);
        }
        dVar36 = dVar36 * local_120;
      }
      else {
        puts("WARNING: b = 0 in sSTOCoulInt");
        dVar36 = 0.0;
      }
    }
    else {
      dVar36 = (-a * dVar39) / (dVar36 * dVar38);
      dVar39 = 0.0;
      dVar41 = 0.0;
      if (0 < n) {
        lVar23 = (long)iVar18;
        uVar6 = n * 2;
        if (n * 2 < 2) {
          uVar6 = 1;
        }
        lVar24 = 0;
        uVar28 = 0;
        local_d8 = iVar18;
        do {
          uVar16 = (uint)uVar28;
          dVar34 = fact[uVar28];
          dVar4 = pow(a * R,(double)(int)uVar16);
          dVar4 = dVar4 * (((dVar38 + dVar38) - (double)(int)uVar16) / dVar34);
          iVar9 = (int)((uVar16 - ((int)(uVar16 - 1) >> 0x1f)) + -1) >> 1;
          dVar40 = 0.0;
          if (-1 < iVar9 + m) {
            lVar25 = 0;
            uVar26 = 0;
            uVar17 = 0;
            uVar19 = m * -2 + 1;
            iVar11 = local_d8;
            iVar1 = iVar18;
            do {
              uVar12 = 0;
              if (0 < (int)uVar19) {
                uVar12 = (ulong)uVar19;
              }
              uVar15 = uVar26;
              if ((int)uVar16 < (int)uVar26) {
                uVar15 = uVar16;
              }
              lVar21 = lVar23 + uVar28 + uVar17 * 2;
              if (0x97 < lVar21) {
LAB_0028f097:
                printf("Error, arguments exceed maximum factorial computed %d > %d\n",lVar21,0x97);
                exit(0);
              }
              uVar14 = (uint)(uVar17 * 2);
              uVar8 = uVar16;
              if ((int)uVar14 < (int)uVar16) {
                uVar8 = uVar14;
              }
              dVar41 = 0.0;
              if ((long)(uVar17 * 2 - lVar23) <= (long)(int)uVar8) {
                pRVar20 = fact + -uVar12;
                lVar22 = 0;
                do {
                  dVar31 = *(double *)((long)pRVar20 + lVar25) * fact[lVar22 + (long)iVar1 + uVar12]
                  ;
                  if (((int)uVar12 + (int)lVar22 & 1U) == 0) {
                    dVar31 = (dVar34 / (*(double *)((long)pRVar20 + lVar24) * fact[lVar22 + uVar12])
                             ) * (fact[lVar23] / dVar31);
                  }
                  else {
                    dVar31 = (-fact[lVar23] / dVar31) *
                             (dVar34 / (*(double *)((long)pRVar20 + lVar24) * fact[lVar22 + uVar12])
                             );
                  }
                  dVar41 = dVar41 + dVar31;
                  lVar22 = lVar22 + 1;
                  pRVar20 = pRVar20 + -1;
                } while ((uVar15 + 1) - uVar12 != lVar22);
              }
              dVar31 = 1.0;
              if (0 < (int)(~uVar14 + uVar27 + uVar16)) {
                dVar32 = 1.0;
                dVar5 = 1.0;
                dVar31 = 1.0;
                iVar10 = iVar11;
                do {
                  dVar5 = dVar5 * (dVar33 / dVar32);
                  dVar31 = dVar31 + dVar5;
                  dVar32 = dVar32 + 1.0;
                  iVar10 = iVar10 + -1;
                } while (iVar10 != 0);
                dVar31 = dVar31 / dVar5;
              }
              dVar5 = exp(dVar30);
              dVar31 = (dVar5 / dVar33) * dVar31 *
                       (dVar41 / ((double)(int)uVar17 + (double)(int)uVar17 + 1.0));
              if ((0.0 < dVar31) && (dVar41 = dVar39, dVar31 < dVar2 / ABS(dVar36 * dVar4)))
              goto LAB_0028eb1d;
              uVar17 = uVar17 + 1;
              dVar40 = dVar40 + dVar31;
              uVar19 = uVar19 + 2;
              uVar26 = uVar26 + 2;
              iVar1 = iVar1 + -2;
              lVar25 = lVar25 + 0x10;
              iVar11 = iVar11 + -2;
            } while (uVar17 != (uint)(iVar9 + m + 1));
          }
          dVar39 = dVar39 + dVar40 * dVar4;
          uVar28 = uVar28 + 1;
          lVar24 = lVar24 + 8;
          local_d8 = local_d8 + 1;
          dVar41 = dVar39;
        } while (uVar28 != uVar6);
      }
LAB_0028eb1d:
      dVar36 = dVar36 * dVar41;
    }
    dVar3 = dVar3 + dVar36;
  }
  else {
    uVar27 = m * 2;
    dVar33 = *(double *)(&DAT_002a82d8 + (long)(int)uVar27 * 8);
    dVar3 = pow(dVar36,(double)(int)uVar27);
    if (n < 1) {
      dVar39 = 0.0;
    }
    else {
      uVar6 = n * 2;
      iVar18 = 1;
      uVar28 = 1;
      if (1 < (int)uVar6) {
        uVar28 = (ulong)uVar6;
      }
      dVar39 = 0.0;
      lVar23 = 0;
      do {
        dVar38 = pow(b + b,(double)(n * 2 + -1 + (int)lVar23));
        dVar30 = *(double *)
                  ("N6OpenMD13ElectrostaticE" + lVar23 * 8 + (long)((m + n) * 2) * 8 + 0x14);
        dVar2 = *(double *)(&DAT_002a82d8 + lVar23 * 8 + (long)(int)uVar6 * 8);
        dVar41 = pow(a + b + a + b,(double)((m + n) * 2 + -1 + (int)lVar23));
        dVar39 = dVar39 + (dVar38 * (double)iVar18 * dVar30) /
                          (dVar41 * (dVar2 + dVar2) * (double)n);
        lVar23 = lVar23 + -1;
        iVar18 = iVar18 + 1;
      } while (-lVar23 != uVar28);
    }
    dVar36 = pow(dVar36,(double)(int)(uVar27 | 1));
    dVar3 = (dVar36 * (dVar33 / dVar3 - dVar39)) / fact[(int)uVar27];
  }
  return dVar3;
}

Assistant:

inline RealType sSTOCoulInt(RealType a, RealType b, int m, int n, RealType R) {
  RealType x, K2;
  RealType Factor1, Factor2, Term, OneElectronTerm;
  RealType eps, epsi;

  // To speed up calculation, we terminate loop once contributions
  // to integral fall below the bound, epsilon
  RealType epsilon = 0.;

  // x is the argument of the auxiliary RosenA and RosenB functions
  x = 2. * a * R;

  // First compute the two-electron component
  RealType sSTOCoulInt_ = 0.;
  if (std::fabs(x) <
      std::numeric_limits<RealType>::epsilon())  // Pathological case
  {
    // This solution for the one-center coulomb integrals comes from
    // Yoshiyuki Hase, Computers & Chemistry 9(4), pp. 285-287 (1985).

    RealType Term1 = fact[2 * m - 1] / pow(2 * a, 2 * m);
    RealType Term2 = 0.;
    for (int nu = 1; nu <= 2 * n; nu++) {
      Term2 += nu * pow(2 * b, 2 * n - nu) * fact[2 * (m + n) - nu - 1] /
               (fact[2 * n - nu] * 2 * n * pow(2 * (a + b), 2 * (m + n) - nu));
    }
    sSTOCoulInt_ = pow(2 * a, 2 * m + 1) * (Term1 - Term2) / fact[2 * m];

    // Original QTPIE code for the one-center case is below.  Doesn't
    // appear to generate the correct one-center results.
    //
    // if ((a==b) && (m==n))
    //   {
    //     for (int nu=0; nu<=2*n-1; nu++)
    //       {
    //         K2 = 0.;
    //         for (unsigned p=0; p<=2*n+m; p++) K2 += 1. / fact[p];
    //         sSTOCoulInt_ += K2 * fact[2*n+m] / fact[m];
    //       }
    //     sSTOCoulInt_ = 2 * a / (n * fact[2*n]) * sSTOCoulInt_;
    //   }
    // else
    //   {
    //     // Not implemented
    //     printf("ERROR, sSTOCoulInt cannot compute from arguments\n");
    //     printf("a = %lf b = %lf m = %d n = %d R = %lf\n",a, b, m, n, R);
    //     exit(0);
    //   }

  } else {
    OneElectronTerm = 1. / R +
                      pow(x, 2 * m) / (fact[2 * m] * R) *
                          ((x - 2 * m) * RosenA(2 * m - 1, x) - exp(-x)) +
                      sSTOCoulInt_;
    eps = epsilon / OneElectronTerm;
    if (a == b) {
      // Apply Rosen (48)
      Factor1 = -a * pow(a * R, 2 * m) / (n * fact[2 * m]);
      for (int nu = 0; nu <= 2 * n - 1; nu++) {
        Factor2 = (2. * n - nu) / fact[nu] * pow(a * R, nu);
        epsi    = eps / fabs(Factor1 * Factor2);
        K2      = 0.;
        for (int p = 0; p <= m + (nu - 1) / 2; p++) {
          Term = RosenD(2 * m - 1, nu, 2 * p) / (2. * p + 1.) *
                 RosenA(2 * m + nu - 1 - 2 * p, x);
          K2 += Term;
          if ((Term > 0) && (Term < epsi)) goto label1;
        }
        sSTOCoulInt_ += K2 * Factor2;
      }
    label1:
      sSTOCoulInt_ *= Factor1;
    } else {
      Factor1 = -a * pow(a * R, 2 * m) / (2. * n * fact[2 * m]);
      epsi    = eps / fabs(Factor1);
      if (b == 0.)
        printf("WARNING: b = 0 in sSTOCoulInt\n");
      else {
        // Apply Rosen (54)
        for (int nu = 0; nu <= 2 * n - 1; nu++) {
          K2 = 0;
          for (int p = 0; p <= 2 * m + nu - 1; p++)
            K2 = K2 + RosenD(2 * m - 1, nu, p) * RosenB(p, R * (a - b)) *
                          RosenA(2 * m + nu - 1 - p, R * (a + b));
          Term = K2 * (2 * n - nu) / fact[nu] * pow(b * R, nu);
          sSTOCoulInt_ += Term;
          if (fabs(Term) < epsi) goto label2;
        }
      label2:
        sSTOCoulInt_ *= Factor1;
      }
    }
    // Now add the one-electron term from Rosen (47) = Rosen (53)
    sSTOCoulInt_ += OneElectronTerm;
  }
  return sSTOCoulInt_;
}